

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

FaceIter __thiscall CMU462::HalfedgeMesh::bevelFace(HalfedgeMesh *this,FaceIter f)

{
  FaceIter FVar1;
  HalfedgeMesh *this_local;
  FaceIter f_local;
  
  FVar1 = facesBegin(this);
  return (FaceIter)FVar1._M_node;
}

Assistant:

FaceIter HalfedgeMesh::bevelFace(FaceIter f) {

    // TODO This method should replace the face f with an additional, inset face (and ring of faces around it),
    // corresponding to a bevel operation. It should return the new face.  NOTE: This method is responsible for
    // updating the *connectivity* of the mesh only---it does not need to update the vertex positions.  These
    // positions will be updated in HalfedgeMesh::_bevel_vtx_reposition_with_dist (which you also have to
    // implement!)

    return facesBegin();
  }